

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

OPJ_BOOL opj_jp2_read_jp2h(opj_jp2_t *jp2,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                          opj_event_mgr_t *p_manager)

{
  bool bVar1;
  OPJ_BOOL OVar2;
  opj_jp2_header_handler_t *poVar3;
  ulong uVar4;
  OPJ_BOOL l_has_ihdr;
  opj_jp2_header_handler_t *l_current_handler;
  OPJ_UINT32 local_40;
  opj_jp2_box_t box;
  OPJ_UINT32 l_current_data_size;
  OPJ_UINT32 l_box_size;
  opj_event_mgr_t *p_manager_local;
  OPJ_BYTE *pOStack_20;
  OPJ_UINT32 p_header_size_local;
  OPJ_BYTE *p_header_data_local;
  opj_jp2_t *jp2_local;
  
  box.init_pos = 0;
  box.type = 0;
  bVar1 = false;
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0xa93,
                  "OPJ_BOOL opj_jp2_read_jp2h(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0xa94,
                  "OPJ_BOOL opj_jp2_read_jp2h(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0xa95,
                  "OPJ_BOOL opj_jp2_read_jp2h(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if ((jp2->jp2_state & 2) == 2) {
    jp2->jp2_img_state = 0;
    pOStack_20 = p_header_data;
    for (p_manager_local._4_4_ = p_header_size; p_manager_local._4_4_ != 0;
        p_manager_local._4_4_ = p_manager_local._4_4_ - l_current_handler._4_4_) {
      OVar2 = opj_jp2_read_boxhdr_char
                        ((opj_jp2_box_t *)((long)&l_current_handler + 4),pOStack_20,
                         (OPJ_UINT32 *)&box.init_pos,p_manager_local._4_4_,p_manager);
      if (OVar2 == 0) {
        opj_event_msg(p_manager,1,"Stream error while reading JP2 Header box\n");
        return 0;
      }
      if (p_manager_local._4_4_ < l_current_handler._4_4_) {
        opj_event_msg(p_manager,1,
                      "Stream error while reading JP2 Header box: box length is inconsistent.\n");
        return 0;
      }
      poVar3 = opj_jp2_img_find_handler(local_40);
      box.type = l_current_handler._4_4_ - box.init_pos;
      uVar4 = (ulong)(uint)box.init_pos;
      if (poVar3 == (opj_jp2_header_handler_t *)0x0) {
        jp2->jp2_img_state = jp2->jp2_img_state | 0x7fffffff;
      }
      else {
        OVar2 = (*poVar3->handler)(jp2,pOStack_20 + uVar4,box.type,p_manager);
        if (OVar2 == 0) {
          return 0;
        }
      }
      if (local_40 == 0x69686472) {
        bVar1 = true;
      }
      pOStack_20 = pOStack_20 + uVar4 + box.type;
    }
    if (bVar1) {
      jp2->jp2_state = jp2->jp2_state | 4;
      jp2->has_jp2h = '\x01';
      jp2_local._4_4_ = 1;
    }
    else {
      opj_event_msg(p_manager,1,"Stream error while reading JP2 Header box: no \'ihdr\' box.\n");
      jp2_local._4_4_ = 0;
    }
  }
  else {
    opj_event_msg(p_manager,1,"The  box must be the first box in the file.\n");
    jp2_local._4_4_ = 0;
  }
  return jp2_local._4_4_;
}

Assistant:

static OPJ_BOOL opj_jp2_read_jp2h(opj_jp2_t *jp2,
                                  OPJ_BYTE *p_header_data,
                                  OPJ_UINT32 p_header_size,
                                  opj_event_mgr_t * p_manager
                                 )
{
    OPJ_UINT32 l_box_size = 0, l_current_data_size = 0;
    opj_jp2_box_t box;
    const opj_jp2_header_handler_t * l_current_handler;
    OPJ_BOOL l_has_ihdr = 0;

    /* preconditions */
    assert(p_header_data != 00);
    assert(jp2 != 00);
    assert(p_manager != 00);

    /* make sure the box is well placed */
    if ((jp2->jp2_state & JP2_STATE_FILE_TYPE) != JP2_STATE_FILE_TYPE) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "The  box must be the first box in the file.\n");
        return OPJ_FALSE;
    }

    jp2->jp2_img_state = JP2_IMG_STATE_NONE;

    /* iterate while remaining data */
    while (p_header_size > 0) {

        if (! opj_jp2_read_boxhdr_char(&box, p_header_data, &l_box_size, p_header_size,
                                       p_manager)) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Stream error while reading JP2 Header box\n");
            return OPJ_FALSE;
        }

        if (box.length > p_header_size) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Stream error while reading JP2 Header box: box length is inconsistent.\n");
            return OPJ_FALSE;
        }

        l_current_handler = opj_jp2_img_find_handler(box.type);
        l_current_data_size = box.length - l_box_size;
        p_header_data += l_box_size;

        if (l_current_handler != 00) {
            if (! l_current_handler->handler(jp2, p_header_data, l_current_data_size,
                                             p_manager)) {
                return OPJ_FALSE;
            }
        } else {
            jp2->jp2_img_state |= JP2_IMG_STATE_UNKNOWN;
        }

        if (box.type == JP2_IHDR) {
            l_has_ihdr = 1;
        }

        p_header_data += l_current_data_size;
        p_header_size -= box.length;
    }

    if (l_has_ihdr == 0) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Stream error while reading JP2 Header box: no 'ihdr' box.\n");
        return OPJ_FALSE;
    }

    jp2->jp2_state |= JP2_STATE_HEADER;
    jp2->has_jp2h = 1;

    return OPJ_TRUE;
}